

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-init.c
# Opt level: O1

void cleanup_projection(void)

{
  ulong uVar1;
  long lVar2;
  
  if (z_info->projection_max != 0) {
    lVar2 = 0;
    uVar1 = 0;
    do {
      string_free(*(char **)((long)&projections->name + lVar2));
      string_free(*(char **)((long)&projections->type + lVar2));
      string_free(*(char **)((long)&projections->desc + lVar2));
      string_free(*(char **)((long)&projections->lash_desc + lVar2));
      string_free(*(char **)((long)&projections->player_desc + lVar2));
      string_free(*(char **)((long)&projections->blind_desc + lVar2));
      uVar1 = uVar1 + 1;
      lVar2 = lVar2 + 0x70;
    } while (uVar1 < z_info->projection_max);
  }
  mem_free(projections);
  return;
}

Assistant:

static void cleanup_projection(void)
{
	int idx;
	for (idx = 0; idx < z_info->projection_max; idx++) {
		string_free(projections[idx].name);
		string_free(projections[idx].type);
		string_free(projections[idx].desc);
		string_free(projections[idx].lash_desc);
		string_free(projections[idx].player_desc);
		string_free(projections[idx].blind_desc);
	}
	mem_free(projections);
}